

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semaphore.cpp
# Opt level: O2

BOOL ReleaseSemaphore(HANDLE hSemaphore,LONG lReleaseCount,LPLONG lpPreviousCount)

{
  PAL_ERROR PVar1;
  CPalThread *pthr;
  PAL_ERROR *pPVar2;
  
  if (PAL_InitializeChakraCoreCalled) {
    pthr = CorUnix::InternalGetCurrentThread();
    PVar1 = CorUnix::InternalReleaseSemaphore(pthr,hSemaphore,lReleaseCount,lpPreviousCount);
    if (PVar1 != 0) {
      pPVar2 = (PAL_ERROR *)__errno_location();
      *pPVar2 = PVar1;
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return (BOOL)(PVar1 == 0);
    }
  }
  abort();
}

Assistant:

BOOL
PALAPI
ReleaseSemaphore(
         IN HANDLE hSemaphore,
         IN LONG lReleaseCount,
         OUT LPLONG lpPreviousCount)
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pthr = NULL;

    PERF_ENTRY(ReleaseSemaphore);
    ENTRY("ReleaseSemaphore(hSemaphore=%p, lReleaseCount=%d, "
          "lpPreviousCount=%p)\n",
          hSemaphore, lReleaseCount, lpPreviousCount);

    pthr = InternalGetCurrentThread();

    palError = InternalReleaseSemaphore(
        pthr,
        hSemaphore,
        lReleaseCount,
        lpPreviousCount
        );

    if (NO_ERROR != palError)
    {
        pthr->SetLastError(palError);
    }

    LOGEXIT ("ReleaseSemaphore returns BOOL %d\n", (NO_ERROR == palError));
    PERF_EXIT(ReleaseSemaphore);
    return (NO_ERROR == palError);
}